

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O2

XmlNamespaceMap * __thiscall
libcellml::traverseTreeForElementNamespaces_abi_cxx11_
          (XmlNamespaceMap *__return_storage_ptr__,libcellml *this,XmlNodePtr *node)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  XmlNodePtr XVar3;
  XmlNodePtr tempNode;
  XmlNamespaceMap subNodeNamespaceMap;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> local_90;
  string local_80;
  string local_60;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,(__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)this);
  while (local_90._M_ptr != (XmlNode *)0x0) {
    bVar2 = XmlNode::isText(local_90._M_ptr);
    if (!bVar2) {
      bVar2 = XmlNode::isComment(local_90._M_ptr);
      if (!bVar2) {
        XmlNode::name_abi_cxx11_(&local_60,local_90._M_ptr);
        XmlNode::namespaceUri_abi_cxx11_(&local_80,local_90._M_ptr);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)__return_storage_ptr__,&local_60,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
      }
    }
    XVar3 = XmlNode::firstChild((XmlNode *)&local_80);
    traverseTreeForElementNamespaces_abi_cxx11_
              ((XmlNamespaceMap *)&local_60,(libcellml *)&local_80,
               (XmlNodePtr *)
               XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::
    _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)__return_storage_ptr__,
               (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )local_60.field_2._8_8_,
               (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )&local_60._M_string_length);
    XmlNode::next((XmlNode *)&local_80);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_90,(__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_60);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

XmlNamespaceMap traverseTreeForElementNamespaces(const XmlNodePtr &node)
{
    XmlNamespaceMap nodeNamespaceMap;
    auto tempNode = node;
    while (tempNode != nullptr) {
        if (!tempNode->isText() && !tempNode->isComment()) {
            nodeNamespaceMap.emplace(tempNode->name(), tempNode->namespaceUri());
        }

        auto subNodeNamespaceMap = traverseTreeForElementNamespaces(tempNode->firstChild());

        nodeNamespaceMap.insert(subNodeNamespaceMap.begin(), subNodeNamespaceMap.end());

        tempNode = tempNode->next();
    }

    return nodeNamespaceMap;
}